

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

iterator __thiscall
QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::lowerBound
          (QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *this,QGraphicsItem **key)

{
  iterator iVar1;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.ptr =
       (totally_ordered_wrapper<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_20.d.ptr ==
       (QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
           *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_*>
          )(QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
       *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
                        *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar1 = std::
          _Rb_tree<QGraphicsItem_*,_std::pair<QGraphicsItem_*const,_QGraphicsItem_*>,_std::_Select1st<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>
          ::lower_bound(&(((this->d).d.ptr)->m)._M_t,key);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)(iterator)iVar1._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator lowerBound(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.lower_bound(key));
    }